

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorPool::DescriptorPool(DescriptorPool *this,DescriptorPool *underlay)

{
  Tables *this_00;
  DescriptorPool *underlay_local;
  DescriptorPool *this_local;
  
  this->mutex_ = (Mutex *)0x0;
  this->fallback_database_ = (DescriptorDatabase *)0x0;
  this->default_error_collector_ = (ErrorCollector *)0x0;
  this->underlay_ = underlay;
  std::
  unique_ptr<absl::lts_20240722::AnyInvocable<void(absl::lts_20240722::FunctionRef<void()>)const>,std::default_delete<absl::lts_20240722::AnyInvocable<void(absl::lts_20240722::FunctionRef<void()>)const>>>
  ::
  unique_ptr<std::default_delete<absl::lts_20240722::AnyInvocable<void(absl::lts_20240722::FunctionRef<void()>)const>>,void>
            ((unique_ptr<absl::lts_20240722::AnyInvocable<void(absl::lts_20240722::FunctionRef<void()>)const>,std::default_delete<absl::lts_20240722::AnyInvocable<void(absl::lts_20240722::FunctionRef<void()>)const>>>
              *)&this->dispatcher_);
  this_00 = (Tables *)operator_new(0x1a0);
  Tables::Tables(this_00);
  std::
  unique_ptr<google::protobuf::DescriptorPool::Tables,std::default_delete<google::protobuf::DescriptorPool::Tables>>
  ::unique_ptr<std::default_delete<google::protobuf::DescriptorPool::Tables>,void>
            ((unique_ptr<google::protobuf::DescriptorPool::Tables,std::default_delete<google::protobuf::DescriptorPool::Tables>>
              *)&this->tables_,this_00);
  this->enforce_dependencies_ = true;
  this->lazily_build_dependencies_ = false;
  this->allow_unknown_ = false;
  this->enforce_weak_ = false;
  this->enforce_extension_declarations_ = false;
  this->disallow_enforce_utf8_ = false;
  this->deprecated_legacy_json_field_conflicts_ = false;
  this->build_started_ = false;
  absl::lts_20240722::
  flat_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::flat_hash_map(&this->direct_input_files_);
  std::
  unique_ptr<google::protobuf::FeatureSetDefaults,std::default_delete<google::protobuf::FeatureSetDefaults>>
  ::unique_ptr<std::default_delete<google::protobuf::FeatureSetDefaults>,void>
            ((unique_ptr<google::protobuf::FeatureSetDefaults,std::default_delete<google::protobuf::FeatureSetDefaults>>
              *)&this->feature_set_defaults_spec_);
  return;
}

Assistant:

DescriptorPool::DescriptorPool(const DescriptorPool* underlay)
    : mutex_(nullptr),
      fallback_database_(nullptr),
      default_error_collector_(nullptr),
      underlay_(underlay),
      tables_(new Tables),
      enforce_dependencies_(true),
      lazily_build_dependencies_(false),
      allow_unknown_(false),
      enforce_weak_(false),
      enforce_extension_declarations_(false),
      disallow_enforce_utf8_(false),
      deprecated_legacy_json_field_conflicts_(false) {}